

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O0

Json __thiscall WorldShuffler::playthrough_as_json_abi_cxx11_(WorldShuffler *this)

{
  bool bVar1;
  reference ppIVar2;
  string *psVar3;
  reference this_00;
  json_value extraout_RDX;
  long in_RSI;
  Json JVar4;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_88;
  __normal_iterator<Item_*const_*,_std::vector<Item_*,_std::allocator<Item_*>_>_> local_78;
  Item **local_70;
  __normal_iterator<Item_*const_*,_std::vector<Item_*,_std::allocator<Item_*>_>_> local_68;
  __normal_iterator<Item_*const_*,_std::vector<Item_*,_std::allocator<Item_*>_>_> local_60 [3];
  Item *local_48;
  Item *key_item_in_source;
  ItemSource *source;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *__range1;
  WorldShuffler *this_local;
  Json *json;
  
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)this,(nullptr_t)0x0);
  __end1 = std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::begin
                     ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)(in_RSI + 0x1530));
  source = (ItemSource *)
           std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::end
                     ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)(in_RSI + 0x1530));
  while (bVar1 = __gnu_cxx::
                 operator==<ItemSource_*const_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                           (&__end1,(__normal_iterator<ItemSource_*const_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                                     *)&source), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppIVar2 = __gnu_cxx::
              __normal_iterator<ItemSource_*const_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
              ::operator*(&__end1);
    key_item_in_source = (Item *)*ppIVar2;
    local_48 = ItemSource::item((ItemSource *)key_item_in_source);
    local_68._M_current =
         (Item **)std::vector<Item_*,_std::allocator<Item_*>_>::begin
                            ((vector<Item_*,_std::allocator<Item_*>_> *)(in_RSI + 0x1518));
    local_70 = (Item **)std::vector<Item_*,_std::allocator<Item_*>_>::end
                                  ((vector<Item_*,_std::allocator<Item_*>_> *)(in_RSI + 0x1518));
    local_60[0] = std::
                  find<__gnu_cxx::__normal_iterator<Item*const*,std::vector<Item*,std::allocator<Item*>>>,Item*>
                            (local_68,(__normal_iterator<Item_*const_*,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                                       )local_70,&local_48);
    local_78._M_current =
         (Item **)std::vector<Item_*,_std::allocator<Item_*>_>::end
                            ((vector<Item_*,_std::allocator<Item_*>_> *)(in_RSI + 0x1518));
    bVar1 = __gnu_cxx::operator==<Item_*const_*,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                      (local_60,&local_78);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      psVar3 = Item::name_abi_cxx11_(local_48);
      nlohmann::
      basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_88,psVar3);
      psVar3 = ItemSource::name_abi_cxx11_((ItemSource *)key_item_in_source);
      this_00 = nlohmann::
                basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator[]((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)this,psVar3);
      nlohmann::
      basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator=(this_00,&local_88);
      nlohmann::
      basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_88);
    }
    __gnu_cxx::
    __normal_iterator<ItemSource_*const_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
    ::operator++(&__end1);
  }
  JVar4.m_value.object = extraout_RDX.object;
  JVar4._0_8_ = this;
  return JVar4;
}

Assistant:

Json WorldShuffler::playthrough_as_json() const
{
    Json json;

    // Filter the logical playthrough to keep only strictly needed key items
    for(ItemSource* source : _logical_playthrough)
    {
        Item* key_item_in_source = source->item();
        if(std::find(_minimal_items_to_complete.begin(), _minimal_items_to_complete.end(), key_item_in_source) != _minimal_items_to_complete.end())
            json[source->name()] = key_item_in_source->name();
    }

    return json;
}